

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::DistributionFunc::checkArguments
          (DistributionFunc *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  Type *pTVar5;
  long lVar6;
  ulong uVar7;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar3 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,this->numArgs,
                     this->numArgs);
  pTVar5 = (Type *)CONCAT71(extraout_var,bVar3);
  lVar6 = 400;
  if (bVar3) {
    bVar3 = this->numArgs != 0;
    if (bVar3) {
      bVar4 = Type::isIntegral(((*args->_M_ptr)->type).ptr);
      pTVar5 = (Type *)CONCAT71(extraout_var_00,bVar4);
      if (bVar4) {
        uVar2 = 1;
        do {
          uVar7 = uVar2;
          bVar3 = uVar7 < this->numArgs;
          if (!bVar3) goto LAB_004a80fa;
          bVar4 = Type::isIntegral((args->_M_ptr[uVar7]->type).ptr);
          pTVar5 = (Type *)CONCAT71(extraout_var_01,bVar4);
          uVar2 = uVar7 + 1;
        } while (bVar4);
      }
      else {
        uVar7 = 0;
      }
      pTVar5 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,args->_M_ptr[uVar7]);
    }
LAB_004a80fa:
    lVar6 = 0x158;
    if (bVar3) {
      return pTVar5;
    }
  }
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar6);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, numArgs, numArgs))
            return comp.getErrorType();

        for (size_t i = 0; i < numArgs; i++) {
            if (!args[i]->type->isIntegral())
                return badArg(context, *args[i]);
        }

        return comp.getIntType();
    }